

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::_::DebugComparison<__11,int&>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
          *params)

{
  CappedArray<char,_14UL> *in_R8;
  String local_70;
  CappedArray<char,_14UL> local_58;
  CappedArray<char,_14UL> local_40;
  
  _::Stringifier::operator*(&local_40,(Stringifier *)&_::STR,*(int *)this);
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,**(int **)(this + 8));
  _::concat<kj::CappedArray<char,14ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (&local_70,(_ *)&local_40,(CappedArray<char,_14UL> *)(this + 0x10),
             (StringPtr *)&local_58,in_R8);
  (__return_storage_ptr__->content).ptr = local_70.content.ptr;
  (__return_storage_ptr__->content).size_ = local_70.content.size_;
  (__return_storage_ptr__->content).disposer = local_70.content.disposer;
  return (String *)local_70.content.disposer;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}